

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::writeBinary(QPDFWriter *this,unsigned_long_long val,uint bytes)

{
  logic_error *this_00;
  element_type *peVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  uint local_38;
  undefined1 local_34 [4];
  uint i;
  uchar data [8];
  unsigned_long_long uStack_18;
  uint bytes_local;
  unsigned_long_long val_local;
  QPDFWriter *this_local;
  
  if (8 < bytes) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"QPDFWriter::writeBinary called with too many bytes");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  uStack_18 = val;
  for (local_38 = 0; local_38 < bytes; local_38 = local_38 + 1) {
    in_CL = (undefined1)uStack_18;
    local_34[(bytes - local_38) - 1] = in_CL;
    uStack_18 = uStack_18 >> 8;
  }
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  ::qpdf::pl::Count::write
            (peVar1->pipeline,(int)local_34,(void *)(ulong)bytes,
             CONCAT71(in_register_00000009,in_CL));
  return;
}

Assistant:

void
QPDFWriter::writeBinary(unsigned long long val, unsigned int bytes)
{
    if (bytes > sizeof(unsigned long long)) {
        throw std::logic_error("QPDFWriter::writeBinary called with too many bytes");
    }
    unsigned char data[sizeof(unsigned long long)];
    for (unsigned int i = 0; i < bytes; ++i) {
        data[bytes - i - 1] = static_cast<unsigned char>(val & 0xff);
        val >>= 8;
    }
    m->pipeline->write(data, bytes);
}